

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::fixColToZero(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  bool bVar1;
  HighsInt row;
  char *__name;
  int iVar2;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  bVar1 = (this->analysis_).logging_on_;
  if (bVar1 == true) {
    HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,4);
  }
  local_50.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.nodeIndex =
       (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.nodeNext =
       (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.head =
       (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[col];
  HighsPostsolveStack::fixedColAtZero<HighsTripletListSlice>
            (postsolve_stack,col,
             (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col],&local_50);
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  iVar2 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  while (iVar2 != -1) {
    __name = (char *)(long)iVar2;
    row = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(long)__name];
    iVar2 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)__name];
    unlink(this,__name);
    reinsertEquation(this,row);
  }
  (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[col] = 0.0;
  (this->analysis_).logging_on_ = bVar1;
  if (bVar1 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,4);
  }
  return;
}

Assistant:

void HPresolve::fixColToZero(HighsPostsolveStack& postsolve_stack,
                             HighsInt col) {
  const bool logging_on = analysis_.logging_on_;
  if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleFixedCol);
  postsolve_stack.fixedColAtZero(col, model->col_cost_[col],
                                 getColumnVector(col));
  // mark the column as deleted first so that it is not registered as singleton
  // column upon removing its nonzeros
  markColDeleted(col);

  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    assert(Acol[coliter] == col);

    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    unlink(colpos);

    reinsertEquation(colrow);
  }

  model->col_cost_[col] = 0;
  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleFixedCol);
}